

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_ff1(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 val;
  TCGTemp *args [1];
  TCGTemp *local_18;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = tcg_ctx->cpu_dregs[insn & 7];
  gen_logic_cc(s,val,2);
  local_18 = (TCGTemp *)(val + (long)tcg_ctx);
  tcg_gen_callN_m68k(tcg_ctx,helper_ff1_m68k,local_18,1,&local_18);
  return;
}

Assistant:

DISAS_INSN(ff1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    reg = DREG(insn, 0);
    gen_logic_cc(s, reg, OS_LONG);
    gen_helper_ff1(tcg_ctx, reg, reg);
}